

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_CorrelationMeter.cpp
# Opt level: O2

int CorrelationMeter::GetFloatBufferCallback
              (UnityAudioEffectState *state,char *name,float *buffer,int numsamples)

{
  EffectData *pEVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  
  pEVar1 = UnityAudioEffectState::GetEffectData<CorrelationMeter::EffectData>(state);
  iVar2 = *(int *)&pEVar1->field_0xc;
  iVar3 = *(int *)&pEVar1->field_0x1c;
  lVar4 = 1;
  for (lVar5 = 0; lVar5 < numsamples / 2; lVar5 = lVar5 + 1) {
    buffer[lVar4 + -1] = *(float *)(*(long *)&pEVar1->field_0x10 + (long)iVar2 * 4);
    if (iVar2 < 1) {
      iVar2 = *(int *)&pEVar1->field_0x8;
    }
    if (lVar4 < numsamples) {
      buffer[lVar4] = *(float *)(*(long *)&pEVar1->field_0x20 + (long)iVar3 * 4);
    }
    if (iVar3 < 1) {
      iVar3 = *(int *)&pEVar1->field_0x18;
    }
    iVar2 = iVar2 + -1;
    iVar3 = iVar3 + -1;
    lVar4 = lVar4 + 2;
  }
  return 0;
}

Assistant:

int UNITY_AUDIODSP_CALLBACK GetFloatBufferCallback(UnityAudioEffectState* state, const char* name, float* buffer, int numsamples)
    {
        EffectData* data = state->GetEffectData<EffectData>();
        HistoryBuffer& l = data->history[0];
        HistoryBuffer& r = data->history[1];
        int w1 = l.writeindex;
        int w2 = r.writeindex;
        for (int n = 0; n < numsamples / 2; n++)
        {
            buffer[n * 2 + 0] = l.data[w1];
            if (--w1 < 0)
                w1 = l.length - 1;
            if (n * 2 + 1 < numsamples)
                buffer[n * 2 + 1] = r.data[w2];
            if (--w2 < 0)
                w2 = r.length - 1;
        }
        return UNITY_AUDIODSP_OK;
    }